

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O0

SESSION_TYPE __thiscall
brynet::net::TcpService::MakeID
          (TcpService *this,size_t loopIndex,shared_ptr<brynet::net::IOLoopData> *loopData)

{
  int iVar1;
  element_type *peVar2;
  TypeIDS<brynet::net::DataSocket_*> *this_00;
  size_t sVar3;
  SessionId sid;
  shared_ptr<brynet::net::IOLoopData> *loopData_local;
  size_t loopIndex_local;
  TcpService *this_local;
  
  peVar2 = std::
           __shared_ptr_access<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)loopData);
  this_00 = IOLoopData::getDataSockets(peVar2);
  sVar3 = TypeIDS<brynet::net::DataSocket_*>::claimID(this_00);
  peVar2 = std::
           __shared_ptr_access<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)loopData);
  iVar1 = IOLoopData::incID(peVar2);
  return CONCAT44(iVar1,CONCAT22((short)sVar3,(short)loopIndex));
}

Assistant:

TcpService::SESSION_TYPE TcpService::MakeID(size_t loopIndex, 
    const std::shared_ptr<IOLoopData>& loopData)
{
    union SessionId sid;
    sid.data.loopIndex = static_cast<uint16_t>(loopIndex);
    sid.data.index = static_cast<uint16_t>(loopData->getDataSockets().claimID());
    sid.data.iid = loopData->incID();

    return sid.id;
}